

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

clock_t __thiscall lest::times::~times(times *this,tms *__buffer)

{
  _Setprecision _Var1;
  ostream *poVar2;
  clock_t extraout_RAX;
  double dVar3;
  times *this_local;
  
  poVar2 = std::operator<<((this->super_action).os,"Elapsed time: ");
  _Var1 = std::setprecision(1);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar3 = timer::elapsed_seconds(&this->total);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
  std::operator<<(poVar2," s\n");
  env::~env(&this->output);
  return extraout_RAX;
}

Assistant:

~times()
    {
        os << "Elapsed time: " << std::setprecision(1) << total.elapsed_seconds() << " s\n";
    }